

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

void melee_effect_elemental(melee_effect_handler_context_t *context,wchar_t type,_Bool pure_element)

{
  wchar_t damage;
  wchar_t local_4c;
  wchar_t local_3c;
  mon_messages local_28;
  wchar_t reduced;
  mon_messages die_msg;
  mon_messages hurt_msg;
  wchar_t elemental_dam;
  wchar_t physical_dam;
  _Bool pure_element_local;
  melee_effect_handler_context_t *pmStack_10;
  wchar_t type_local;
  melee_effect_handler_context_t *context_local;
  
  reduced = L'\0';
  local_28 = MON_MSG_DIE;
  if (pure_element) {
    context->obvious = true;
  }
  elemental_dam._3_1_ = pure_element;
  physical_dam = type;
  pmStack_10 = context;
  if (context->p != (player *)0x0) {
    switch(type) {
    case L'\0':
      msg("You are covered in acid!");
      break;
    case L'\x01':
      msg("You are struck by electricity!");
      break;
    case L'\x02':
      msg("You are enveloped in flames!");
      break;
    case L'\x03':
      msg("You are covered with frost!");
    }
  }
  hurt_msg = adjust_dam_armor(pmStack_10->damage,pmStack_10->ac + L'2');
  if ((pmStack_10->method->phys & 1U) == 0) {
    hurt_msg = MON_MSG_NONE;
  }
  if (pmStack_10->p == (player *)0x0) {
    if (pmStack_10->t_mon == (monster *)0x0) {
      __assert_fail("context->t_mon",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-blows.c"
                    ,0x1c4,
                    "void melee_effect_elemental(melee_effect_handler_context_t *, int, _Bool)");
    }
    die_msg = monster_elemental_damage(pmStack_10,physical_dam,(mon_messages *)&reduced,&local_28);
  }
  else {
    die_msg = adjust_dam(pmStack_10->p,physical_dam,pmStack_10->damage,RANDOMISE,L'\0',true);
  }
  if ((int)die_msg < (int)hurt_msg) {
    local_3c = hurt_msg;
  }
  else {
    local_3c = die_msg;
  }
  pmStack_10->damage = local_3c;
  if ((pmStack_10->p != (player *)0x0) && (0 < (int)die_msg)) {
    if ((int)(die_msg * 5) < 0x12d) {
      local_4c = die_msg * 5;
    }
    else {
      local_4c = L'Ĭ';
    }
    inven_damage(pmStack_10->p,physical_dam,local_4c);
  }
  if (L'\0' < pmStack_10->damage) {
    if (pmStack_10->p == (player *)0x0) {
      if (pmStack_10->t_mon == (monster *)0x0) {
        __assert_fail("context->t_mon",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-blows.c"
                      ,0x1dc,
                      "void melee_effect_elemental(melee_effect_handler_context_t *, int, _Bool)");
      }
      display_blow_message_vs_monster(pmStack_10->method,pmStack_10->m_name,pmStack_10->t_mon->midx)
      ;
      mon_take_nonplayer_hit(pmStack_10->damage,pmStack_10->t_mon,reduced,local_28);
    }
    else {
      damage = player_apply_damage_reduction(pmStack_10->p,pmStack_10->damage);
      display_blow_message_vs_player(pmStack_10->method,pmStack_10->m_name,pmStack_10->p,damage);
      take_hit(pmStack_10->p,damage,pmStack_10->ddesc);
    }
  }
  if (((elemental_dam._3_1_ & 1) != 0) && (pmStack_10->p != (player *)0x0)) {
    update_smart_learn(pmStack_10->mon,pmStack_10->p,L'\0',L'\0',physical_dam);
  }
  return;
}

Assistant:

static void melee_effect_elemental(melee_effect_handler_context_t *context,
								   int type, bool pure_element)
{
	int physical_dam, elemental_dam;
	enum mon_messages hurt_msg = MON_MSG_NONE;
	enum mon_messages die_msg = MON_MSG_DIE;

	if (pure_element)
		/* Obvious */
		context->obvious = true;

	if (context->p) {
		switch (type) {
			case PROJ_ACID: msg("You are covered in acid!");
				break;
			case PROJ_ELEC: msg("You are struck by electricity!");
				break;
			case PROJ_FIRE: msg("You are enveloped in flames!");
				break;
			case PROJ_COLD: msg("You are covered with frost!");
				break;
		}
	}

	/* Give a small bonus to ac for elemental attacks */
	physical_dam = adjust_dam_armor(context->damage, context->ac + 50);

	/* Some attacks do no physical damage */
	if (!context->method->phys)
		physical_dam = 0;

	if (context->p) {
		elemental_dam = adjust_dam(context->p, type, context->damage,
								   RANDOMISE, 0, true);
	} else {
		assert(context->t_mon);
		elemental_dam = monster_elemental_damage(context, type, &hurt_msg,
												 &die_msg);
	}

	/* Take the larger of physical or elemental damage */
	context->damage = (physical_dam > elemental_dam) ?
		physical_dam : elemental_dam;

	if (context->p && elemental_dam > 0)
		inven_damage(context->p, type, MIN(elemental_dam * 5, 300));
	if (context->damage > 0) {
		if (context->p) {
			/*
			 * Player damage reduction does not affect the damage]				 * used for side effect calculations so leave
			 * context->damage as is.
			 */
			int reduced = player_apply_damage_reduction(context->p,
				context->damage);

			display_blow_message_vs_player(context->method,
				context->m_name, context->p, reduced);
			take_hit(context->p, reduced, context->ddesc);
		} else {
			assert(context->t_mon);
			display_blow_message_vs_monster(context->method,
				context->m_name, context->t_mon->midx);
			(void) mon_take_nonplayer_hit(context->damage,
				context->t_mon, hurt_msg, die_msg);
		}
	}

	/* Learn about the player */
	if (pure_element && context->p) {
		update_smart_learn(context->mon, context->p, 0, 0, type);
	}
}